

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_ast.h
# Opt level: O3

Ref __thiscall
cashew::ValueBuilder::makeCall<cashew::Ref,cashew::Ref,cashew::Ref,cashew::Ref>
          (ValueBuilder *this,IString target,Ref args,Ref args_1,Ref args_2,Ref args_3)

{
  char *pcVar1;
  Value *pVVar2;
  Ref RVar3;
  Ref RVar4;
  size_t i;
  long lVar5;
  void *pvVar6;
  Value *local_68;
  Ref argArray [4];
  
  pVVar2 = (Value *)MixedArena::allocSpace((MixedArena *)&arena,0x18,8);
  pVVar2->type = Null;
  RVar3.inst = Value::setArray(pVVar2,4);
  argArray[0] = args;
  argArray[1] = args_1;
  argArray[2] = args_2;
  lVar5 = 0;
  do {
    Value::push_back(RVar3.inst,argArray[lVar5 + -1].inst);
    lVar5 = lVar5 + 1;
  } while (lVar5 != 4);
  pVVar2 = (Value *)MixedArena::allocSpace((MixedArena *)&arena,0x18,8);
  pVVar2->type = Null;
  pVVar2 = Value::setArray(pVVar2,3);
  pvVar6 = (void *)0x18;
  RVar4.inst = (Value *)MixedArena::allocSpace((MixedArena *)&arena,0x18,8);
  (RVar4.inst)->type = Null;
  Value::free(RVar4.inst,pvVar6);
  (RVar4.inst)->type = String;
  pcVar1 = DIV;
  ((RVar4.inst)->field_1).str.str._M_len = CALL;
  ((RVar4.inst)->field_1).str.str._M_str = pcVar1;
  pVVar2 = Value::push_back(pVVar2,RVar4);
  pvVar6 = (void *)0x18;
  RVar4.inst = (Value *)MixedArena::allocSpace((MixedArena *)&arena,0x18,8);
  (RVar4.inst)->type = Null;
  Value::free(RVar4.inst,pvVar6);
  (RVar4.inst)->type = String;
  ((RVar4.inst)->field_1).arr = (ArrayStorage *)this;
  ((RVar4.inst)->field_1).str.str._M_str = (char *)target.str._M_len;
  pVVar2 = Value::push_back(pVVar2,RVar4);
  RVar3.inst = Value::push_back(pVVar2,RVar3);
  return (Ref)RVar3.inst;
}

Assistant:

static Ref makeCall(IString target, Ts... args) {
    size_t nArgs = sizeof...(Ts);
    Ref callArgs = makeRawArray(nArgs);
    Ref argArray[] = {args...};
    for (size_t i = 0; i < nArgs; ++i) {
      callArgs->push_back(argArray[i]);
    }
    return &makeRawArray(3)
              ->push_back(makeRawString(CALL))
              .push_back(makeName(target))
              .push_back(callArgs);
  }